

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifTune.c
# Opt level: O3

int Ifn_ManStrCheck2(char *pStr,int *pnInps,int *pnObjs)

{
  byte bVar1;
  int iVar2;
  uint uVar3;
  char *pcVar4;
  byte bVar6;
  int iVar7;
  ulong uVar8;
  int *piVar9;
  int iVar10;
  ulong uVar11;
  int Marks [32];
  int local_88 [32];
  ulong uVar5;
  
  local_88[0x1c] = 0;
  local_88[0x1d] = 0;
  local_88[0x1e] = 0;
  local_88[0x1f] = 0;
  local_88[0x18] = 0;
  local_88[0x19] = 0;
  local_88[0x1a] = 0;
  local_88[0x1b] = 0;
  local_88[0x14] = 0;
  local_88[0x15] = 0;
  local_88[0x16] = 0;
  local_88[0x17] = 0;
  local_88[0x10] = 0;
  local_88[0x11] = 0;
  local_88[0x12] = 0;
  local_88[0x13] = 0;
  local_88[0xc] = 0;
  local_88[0xd] = 0;
  local_88[0xe] = 0;
  local_88[0xf] = 0;
  local_88[8] = 0;
  local_88[9] = 0;
  local_88[10] = 0;
  local_88[0xb] = 0;
  local_88[4] = 0;
  local_88[5] = 0;
  local_88[6] = 0;
  local_88[7] = 0;
  local_88[0] = 0;
  local_88[1] = 0;
  local_88[2] = 0;
  local_88[3] = 0;
  pcVar4 = pStr + 1;
  iVar7 = 0;
  do {
    bVar1 = pcVar4[-1];
    uVar5 = (ulong)bVar1;
    iVar2 = iVar7;
    if (uVar5 < 0x3f) {
      if ((0x7800030000000000U >> (uVar5 & 0x3f) & 1) == 0) {
        if (uVar5 != 0) goto LAB_003bbe3c;
        pcVar4 = pStr + 1;
        uVar5 = 0;
        break;
      }
    }
    else {
LAB_003bbe3c:
      if (((0x22 < bVar1 - 0x5b) || ((0x500000005U >> ((ulong)(bVar1 - 0x5b) & 0x3f) & 1) == 0)) &&
         (0x19 < (byte)(bVar1 + 0xbf))) {
        if (0x19 < (byte)(bVar1 + 0x9f)) goto LAB_003bbf76;
        if (*pcVar4 == '=') {
          local_88[(byte)(bVar1 + 0x9f)] = 2;
          iVar2 = bVar1 - 0x61;
          if ((int)(bVar1 - 0x61) < iVar7) {
            iVar2 = iVar7;
          }
        }
      }
    }
    pcVar4 = pcVar4 + 1;
    iVar7 = iVar2;
  } while( true );
LAB_003bbe90:
  bVar1 = pcVar4[-1];
  uVar11 = (ulong)bVar1;
  iVar2 = (int)uVar5;
  uVar8 = uVar5;
  if (uVar11 < 0x3f) {
    if ((0x7800030000000000U >> (uVar11 & 0x3f) & 1) == 0) {
      if (uVar11 != 0) goto LAB_003bbea6;
      uVar8 = 0;
      goto LAB_003bbf01;
    }
  }
  else {
LAB_003bbea6:
    if (((0x22 < bVar1 - 0x5b) || ((0x500000005U >> ((ulong)(bVar1 - 0x5b) & 0x3f) & 1) == 0)) &&
       (0x19 < (byte)(bVar1 + 0xbf))) {
      bVar6 = bVar1 + 0x9f;
      if (0x19 < bVar6) goto LAB_003bbf76;
      if ((*pcVar4 != '=') && (local_88[bVar6] != 2)) {
        local_88[bVar6] = 1;
        uVar8 = (ulong)(bVar1 - 0x61);
        if ((int)(bVar1 - 0x61) < iVar2) {
          uVar8 = uVar5;
        }
      }
    }
  }
  pcVar4 = pcVar4 + 1;
  uVar5 = uVar8;
  goto LAB_003bbe90;
LAB_003bbf76:
  uVar5 = (ulong)(uint)(int)(char)bVar1;
  pcVar4 = "String \"%s\" contains unrecognized symbol \'%c\'.\n";
LAB_003bbf97:
  Ifn_ErrorMessage(pcVar4,pStr,uVar5);
  return 0;
  while (uVar8 = uVar8 + 1, iVar7 + 1U != uVar8) {
LAB_003bbf01:
    if (local_88[uVar8] == 0) {
      iVar7 = (int)uVar8;
      pcVar4 = "String \"%s\" has no symbol \'%c\'.\n";
      goto LAB_003bbf8f;
    }
  }
  uVar8 = 0;
  do {
    if (local_88[uVar8] == 2) {
      iVar7 = (int)uVar8;
      pcVar4 = "String \"%s\" has definition of input variable \'%c\'.\n";
LAB_003bbf8f:
      uVar5 = (ulong)(iVar7 + 0x61);
      goto LAB_003bbf97;
    }
    uVar8 = uVar8 + 1;
  } while (iVar2 + 1U != uVar8);
  if (iVar2 < iVar7) {
    uVar3 = iVar2 + 0x62;
    piVar9 = local_88 + uVar5;
    do {
      uVar5 = (ulong)uVar3;
      piVar9 = piVar9 + 1;
      if (*piVar9 == 1) {
        pcVar4 = "String \"%s\" has no definition for internal variable \'%c\'.\n";
        goto LAB_003bbf97;
      }
      iVar10 = uVar3 - iVar7;
      uVar3 = uVar3 + 1;
    } while (iVar10 != 0x61);
  }
  *pnInps = iVar2 + 1U;
  *pnObjs = iVar7 + 1U;
  return 1;
}

Assistant:

int Ifn_ManStrCheck2( char * pStr, int * pnInps, int * pnObjs )
{
    int i, Marks[32] = {0}, MaxVar = 0, MaxDef = 0;
    for ( i = 0; pStr[i]; i++ )
    {
        if ( pStr[i] == '=' || pStr[i] == ';' || 
             pStr[i] == '(' || pStr[i] == ')' || 
             pStr[i] == '[' || pStr[i] == ']' || 
             pStr[i] == '<' || pStr[i] == '>' || 
             pStr[i] == '{' || pStr[i] == '}' )
            continue;
        if ( pStr[i] >= 'A' && pStr[i] <= 'Z' )
            continue;
        if ( pStr[i] >= 'a' && pStr[i] <= 'z' )
        {
            if ( pStr[i+1] == '=' )
                Marks[pStr[i] - 'a'] = 2, MaxDef = Abc_MaxInt(MaxDef, pStr[i] - 'a');
            continue;
        }
        return Ifn_ErrorMessage( "String \"%s\" contains unrecognized symbol \'%c\'.\n", pStr, pStr[i] );
    }
    for ( i = 0; pStr[i]; i++ )
    {
        if ( pStr[i] == '=' || pStr[i] == ';' || 
             pStr[i] == '(' || pStr[i] == ')' || 
             pStr[i] == '[' || pStr[i] == ']' || 
             pStr[i] == '<' || pStr[i] == '>' || 
             pStr[i] == '{' || pStr[i] == '}' )
            continue;
        if ( pStr[i] >= 'A' && pStr[i] <= 'Z' )
            continue;
        if ( pStr[i] >= 'a' && pStr[i] <= 'z' )
        {
            if ( pStr[i+1] != '=' && Marks[pStr[i] - 'a'] != 2 )
                Marks[pStr[i] - 'a'] = 1, MaxVar = Abc_MaxInt(MaxVar, pStr[i] - 'a');
            continue;
        }
        return Ifn_ErrorMessage( "String \"%s\" contains unrecognized symbol \'%c\'.\n", pStr, pStr[i] );
    }
    MaxVar++;
    MaxDef++;
    for ( i = 0; i < MaxDef; i++ )
        if ( Marks[i] == 0 )
            return Ifn_ErrorMessage( "String \"%s\" has no symbol \'%c\'.\n", pStr, 'a' + i );
    for ( i = 0; i < MaxVar; i++ )
        if ( Marks[i] == 2 )
            return Ifn_ErrorMessage( "String \"%s\" has definition of input variable \'%c\'.\n", pStr, 'a' + i );
    for ( i = MaxVar; i < MaxDef; i++ )
        if ( Marks[i] == 1 )
            return Ifn_ErrorMessage( "String \"%s\" has no definition for internal variable \'%c\'.\n", pStr, 'a' + i );
    *pnInps = MaxVar;
    *pnObjs = MaxDef;
    return 1;
}